

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationDataBuilder::addCE(CollationDataBuilder *this,int64_t ce,UErrorCode *errorCode)

{
  int32_t iVar1;
  int64_t iVar2;
  int32_t local_30;
  int32_t i;
  int32_t length;
  UErrorCode *errorCode_local;
  int64_t ce_local;
  CollationDataBuilder *this_local;
  
  iVar1 = UVector64::size(&this->ce64s);
  local_30 = 0;
  while( true ) {
    if (iVar1 <= local_30) {
      UVector64::addElement(&this->ce64s,ce,errorCode);
      return iVar1;
    }
    iVar2 = UVector64::elementAti(&this->ce64s,local_30);
    if (ce == iVar2) break;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

int32_t
CollationDataBuilder::addCE(int64_t ce, UErrorCode &errorCode) {
    int32_t length = ce64s.size();
    for(int32_t i = 0; i < length; ++i) {
        if(ce == ce64s.elementAti(i)) { return i; }
    }
    ce64s.addElement(ce, errorCode);
    return length;
}